

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_compile(jx9 *pEngine,char *zSource,int nLen,jx9_vm **ppOutVm)

{
  undefined1 auStack_40 [4];
  int rc;
  SyString sScript;
  jx9_vm **ppOutVm_local;
  char *pcStack_20;
  int nLen_local;
  char *zSource_local;
  jx9 *pEngine_local;
  
  if ((pEngine == (jx9 *)0x0) || (pEngine->nMagic != 0xf874bcd7)) {
    pEngine_local._4_4_ = -0x18;
  }
  else {
    ppOutVm_local._4_4_ = nLen;
    pcStack_20 = zSource;
    if (zSource == (char *)0x0) {
      pcStack_20 = ";";
      ppOutVm_local._4_4_ = 1;
    }
    sScript._8_8_ = ppOutVm;
    if ((int)ppOutVm_local._4_4_ < 0) {
      ppOutVm_local._4_4_ = SyStrlen(pcStack_20);
    }
    _auStack_40 = pcStack_20;
    sScript.zString._0_4_ = ppOutVm_local._4_4_;
    pEngine_local._4_4_ =
         ProcessScript(pEngine,(jx9_vm **)sScript._8_8_,(SyString *)auStack_40,0,(char *)0x0);
  }
  return pEngine_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_compile(jx9 *pEngine, const char *zSource, int nLen, jx9_vm **ppOutVm)
{
	SyString sScript;
	int rc;
	if( JX9_ENGINE_MISUSE(pEngine) ){
		return JX9_CORRUPT;
	}
	if( zSource == 0 ){
		/* Empty Jx9 statement ';' */
		zSource = ";";
		nLen = (int)sizeof(char);
	}
	if( nLen < 0 ){
		/* Compute input length automatically */
		nLen = (int)SyStrlen(zSource);
	}
	SyStringInitFromBuf(&sScript, zSource, nLen);
#if defined(JX9_ENABLE_THREADS)
	 /* Acquire engine mutex */
	 SyMutexEnter(sJx9MPGlobal.pMutexMethods, pEngine->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
	 if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE && 
		 JX9_THRD_ENGINE_RELEASE(pEngine) ){
			 return JX9_ABORT; /* Another thread have released this instance */
	 }
#endif
	/* Compile the script */
	rc = ProcessScript(&(*pEngine),ppOutVm,&sScript,0,0);
#if defined(JX9_ENABLE_THREADS)
	 /* Leave engine mutex */
	 SyMutexLeave(sJx9MPGlobal.pMutexMethods, pEngine->pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel != JX9_THREAD_LEVEL_MULTI */
#endif
	/* Compilation result */
	return rc;
}